

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

void __thiscall
gl3cts::TransformFeedback::DrawXFBStream::setupVertexArray(DrawXFBStream *this,GLuint bo_id)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 uVar3;
  undefined4 extraout_var;
  long lVar4;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x40))(0x8892,bo_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x15a3);
  uVar3 = (**(code **)(lVar4 + 0x780))(this->m_program_id_draw,"position");
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glGetAttribLocation call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x15a6);
  (**(code **)(lVar4 + 0x19f0))(uVar3,4,0x1406,0,0,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glVertexAttribPointer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x15a9);
  (**(code **)(lVar4 + 0x610))(uVar3);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glEnableVertexAttribArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x15ac);
  return;
}

Assistant:

void gl3cts::TransformFeedback::DrawXFBStream::setupVertexArray(glw::GLuint bo_id)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindBuffer(GL_ARRAY_BUFFER, bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	glw::GLuint position_location = gl.getAttribLocation(m_program_id_draw, "position");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetAttribLocation call failed.");

	gl.vertexAttribPointer(position_location, 4, GL_FLOAT, GL_FALSE, 0, NULL);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribPointer call failed.");

	gl.enableVertexAttribArray(position_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");
}